

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O0

void __thiscall
solitaire::SolitaireEmptyHandTest_tryUncoverTableauPileTopCard_Test::
~SolitaireEmptyHandTest_tryUncoverTableauPileTopCard_Test
          (SolitaireEmptyHandTest_tryUncoverTableauPileTopCard_Test *this)

{
  SolitaireEmptyHandTest_tryUncoverTableauPileTopCard_Test *this_local;
  
  ~SolitaireEmptyHandTest_tryUncoverTableauPileTopCard_Test(this);
  operator_delete(this,0x218);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryUncoverTableauPileTopCard) {
    InSequence seq;
    EXPECT_CALL(lastTableauPileMock, isTopCardCovered()).WillOnce(Return(true));
    expectSnapshotCreation(lastTableauPileMock, snapshotMock);
    EXPECT_CALL(lastTableauPileMock, tryUncoverTopCard());
    EXPECT_CALL(*historyTrackerMock, save(Pointer(snapshotMock.get())));

    solitaire.tryUncoverTableauPileTopCard(lastTableauPileId);
}